

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool operator>(BigNum *a,BigNum *b)

{
  uint uVar1;
  int iVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  
  cVar3 = a->sign;
  if ((bool)cVar3 == b->sign) {
    uVar1 = a->length;
    uVar5 = (ulong)uVar1;
    iVar7 = b->length;
    cVar3 = '\x01';
    if ((int)uVar1 <= iVar7) {
      if (iVar7 <= (int)uVar1) {
        do {
          bVar6 = (byte)iVar7;
          iVar4 = (int)uVar5;
          if (iVar4 < 1) goto LAB_00102351;
          iVar7 = (a->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar5 - 1];
          iVar2 = (b->digits).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar5 - 1];
          if (iVar2 < iVar7) {
            bVar6 = 1;
            goto LAB_00102351;
          }
          uVar5 = uVar5 - 1;
        } while (iVar2 <= iVar7);
        bVar6 = 0;
LAB_00102351:
        return (bool)(0 < iVar4 & bVar6);
      }
      cVar3 = '\0';
    }
  }
  return (bool)cVar3;
}

Assistant:

bool operator >(BigNum a, BigNum b){
    if (a.sign != b.sign){
        if (a.sign)
            return true;
        else
            return false;
    }
    else {
        if (a.sign){
            if (a.length > b.length)
                return true;
            else if (b.length > a.length)
                return false;
            else {
                for (int i = a.length - 1; i >= 0; i--){
                    if (a.digits[i] > b.digits[i])
                        return true;
                    else if (a.digits[i] < b.digits[i])
                        return  false;
                }
                return false;
            }
        }
    }
}